

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DestroySurface::exec(DestroySurface *this,Thread *t)

{
  _func_int **pp_Var1;
  EGLDisplay pvVar2;
  deUint32 err;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Surface *pSVar5;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  DestroySurface *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [28])"Begin -- eglDestroySurface(");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_display);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [4])",  ");
  pSVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pSVar5->surface);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    pp_Var1 = local_20[1].super_Thread._vptr_Thread;
    pvVar2 = this->m_display;
    pSVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator->(&this->m_surface);
    (**(code **)(*pp_Var1 + 0xb0))(pp_Var1,pvVar2,pSVar5->surface);
    err = (**(code **)(*local_20[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"destroySurface(m_display, m_surface->surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x358);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [27])"End -- eglDestroySurface()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  return;
}

Assistant:

void DestroySurface::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroySurface(" << m_display << ",  " << m_surface->surface << ")" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, destroySurface(m_display, m_surface->surface));
	thread.newMessage() << "End -- eglDestroySurface()" << tcu::ThreadUtil::Message::End;
}